

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog_set.cpp
# Opt level: O2

bool __thiscall
duckdb::CatalogSet::DropDependencies
          (CatalogSet *this,CatalogTransaction transaction,string *name,bool cascade,
          bool allow_drop_internal)

{
  int iVar1;
  optional_ptr<duckdb::CatalogEntry,_true> oVar2;
  CatalogEntry *pCVar3;
  undefined4 extraout_var;
  DependencyManager *this_00;
  CatalogException *this_01;
  EntryLookup EVar4;
  allocator local_79;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  EVar4 = GetEntryDetailed(this,transaction,name);
  oVar2 = EVar4.result.ptr;
  if (oVar2.ptr != (CatalogEntry *)0x0) {
    entry.ptr = oVar2.ptr;
    pCVar3 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
    if (pCVar3->internal == true && !allow_drop_internal) {
      this_01 = (CatalogException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_70,
                 "Cannot drop entry \"%s\" because it is an internal system entry",&local_79);
      pCVar3 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
      ::std::__cxx11::string::string((string *)&local_50,(string *)&pCVar3->name);
      CatalogException::CatalogException<std::__cxx11::string>(this_01,&local_70,&local_50);
      __cxa_throw(this_01,&CatalogException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pCVar3 = optional_ptr<duckdb::CatalogEntry,_true>::operator->(&entry);
    iVar1 = (*pCVar3->_vptr_CatalogEntry[0xb])(pCVar3);
    local_70._M_dataplus._M_p =
         (pointer)(**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0xd0))
                            ((long *)CONCAT44(extraout_var,iVar1));
    this_00 = optional_ptr<duckdb::DependencyManager,_true>::operator->
                        ((optional_ptr<duckdb::DependencyManager,_true> *)&local_70);
    pCVar3 = optional_ptr<duckdb::CatalogEntry,_true>::operator*(&entry);
    DependencyManager::DropObject(this_00,transaction,pCVar3,cascade);
  }
  return oVar2.ptr != (CatalogEntry *)0x0;
}

Assistant:

bool CatalogSet::DropDependencies(CatalogTransaction transaction, const string &name, bool cascade,
                                  bool allow_drop_internal) {
	auto entry = GetEntry(transaction, name);
	if (!entry) {
		return false;
	}
	if (entry->internal && !allow_drop_internal) {
		throw CatalogException("Cannot drop entry \"%s\" because it is an internal system entry", entry->name);
	}
	// check any dependencies of this object
	D_ASSERT(entry->ParentCatalog().IsDuckCatalog());
	auto &duck_catalog = entry->ParentCatalog().Cast<DuckCatalog>();
	duck_catalog.GetDependencyManager()->DropObject(transaction, *entry, cascade);
	return true;
}